

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O0

void __thiscall PKCS7Test_CertReparseNSS_Test::TestBody(PKCS7Test_CertReparseNSS_Test *this)

{
  string_view s;
  string local_50;
  undefined1 local_30 [16];
  Span<const_unsigned_char> local_20;
  PKCS7Test_CertReparseNSS_Test *local_10;
  PKCS7Test_CertReparseNSS_Test *this_local;
  
  local_10 = this;
  GetTestData_abi_cxx11_(&local_50,"crypto/pkcs7/test/nss.p7c");
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  s._M_str = local_30._8_8_;
  s._M_len = (size_t)s._M_str;
  local_20 = bssl::StringAsBytes(local_30._0_8_,s);
  TestCertReparse(local_20);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST(PKCS7Test, CertReparseNSS) {
  // nss.p7c contains the certificate chain of mail.google.com, as saved by NSS
  // using the Chrome UI.
  TestCertReparse(
      bssl::StringAsBytes(GetTestData("crypto/pkcs7/test/nss.p7c")));
}